

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxUnaryNotBoolean::Resolve(FxUnaryNotBoolean *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  FxBoolCast *this_00;
  undefined4 extraout_var_00;
  FxConstant *this_01;
  FxExpression *size;
  FxExpression *e;
  byte local_2d;
  bool result;
  FCompileContext *local_20;
  FCompileContext *ctx_local;
  FxUnaryNotBoolean *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    local_20 = ctx;
    ctx_local = (FCompileContext *)this;
    if (this->Operand != (FxExpression *)0x0) {
      iVar2 = (*this->Operand->_vptr_FxExpression[2])();
      this->Operand = (FxExpression *)CONCAT44(extraout_var,iVar2);
    }
    if (this->Operand == (FxExpression *)0x0) {
      if (this != (FxUnaryNotBoolean *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxUnaryNotBoolean *)0x0;
    }
    else {
      if (this->Operand->ValueType != (PType *)TypeBool) {
        this_00 = (FxBoolCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)ctx);
        FxBoolCast::FxBoolCast(this_00,this->Operand,true);
        this->Operand = (FxExpression *)this_00;
        if (this->Operand != (FxExpression *)0x0) {
          iVar2 = (*this->Operand->_vptr_FxExpression[2])(this->Operand,local_20);
          this->Operand = (FxExpression *)CONCAT44(extraout_var_00,iVar2);
        }
        if (this->Operand == (FxExpression *)0x0) {
          if (this != (FxUnaryNotBoolean *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          return (FxExpression *)0x0;
        }
      }
      uVar3 = (*this->Operand->_vptr_FxExpression[3])();
      if ((uVar3 & 1) == 0) {
        (this->super_FxExpression).ValueType = (PType *)TypeBool;
        this_local = this;
      }
      else {
        size = this->Operand;
        FxConstant::GetValue((FxConstant *)&e);
        bVar1 = ExpVal::GetBool((ExpVal *)&e);
        ExpVal::~ExpVal((ExpVal *)&e);
        local_2d = ~bVar1 & 1;
        this_01 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
        FxConstant::FxConstant
                  (this_01,(bool)(local_2d & 1),&(this->super_FxExpression).ScriptPosition);
        this_local = (FxUnaryNotBoolean *)this_01;
        if (this != (FxUnaryNotBoolean *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
      }
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxUnaryNotBoolean::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Operand, ctx);

	if (Operand->ValueType != TypeBool)
	{
		Operand = new FxBoolCast(Operand);
		SAFE_RESOLVE(Operand, ctx);
	}

	if (Operand->isConstant())
	{
		bool result = !static_cast<FxConstant *>(Operand)->GetValue().GetBool();
		FxExpression *e = new FxConstant(result, ScriptPosition);
		delete this;
		return e;
	}

	ValueType = TypeBool;
	return this;
}